

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O3

void nghttp3_qpack_encoder_unblock_stream
               (nghttp3_qpack_encoder *encoder,nghttp3_qpack_stream *stream)

{
  nghttp3_pq_entry *pnVar1;
  nghttp3_blocked_streams_key bsk;
  nghttp3_ksl_it local_40;
  size_t local_28;
  int64_t local_20;
  
  pnVar1 = nghttp3_pq_top(&stream->max_cnts);
  local_28 = pnVar1[2].index;
  local_20 = stream->stream_id;
  nghttp3_ksl_lower_bound(&local_40,&encoder->blocked_streams,&local_28);
  if ((local_40.i == ((local_40.blk)->field_0).field_0.n) &&
     (((local_40.blk)->field_0).field_0.next == (nghttp3_ksl_blk *)0x0)) {
    __assert_fail("!nghttp3_ksl_it_end(&it)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                  ,0x8f5,
                  "void nghttp3_qpack_encoder_unblock_stream(nghttp3_qpack_encoder *, nghttp3_qpack_stream *)"
                 );
  }
  if (*(nghttp3_qpack_stream **)
       ((long)&(local_40.blk)->field_0 + local_40.i * (local_40.ksl)->nodelen + 0x18) == stream) {
    nghttp3_ksl_remove_hint(&encoder->blocked_streams,(nghttp3_ksl_it *)0x0,&local_40,&local_28);
    return;
  }
  __assert_fail("nghttp3_ksl_it_get(&it) == stream",
                "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                ,0x8f6,
                "void nghttp3_qpack_encoder_unblock_stream(nghttp3_qpack_encoder *, nghttp3_qpack_stream *)"
               );
}

Assistant:

void nghttp3_qpack_encoder_unblock_stream(nghttp3_qpack_encoder *encoder,
                                          nghttp3_qpack_stream *stream) {
  nghttp3_blocked_streams_key bsk = {
    .max_cnt = nghttp3_struct_of(nghttp3_pq_top(&stream->max_cnts),
                                 nghttp3_qpack_header_block_ref, max_cnts_pe)
                 ->max_cnt,
    .id = (uint64_t)stream->stream_id,
  };
  nghttp3_ksl_it it;

  /* This is purely debugging purpose only */
  it = nghttp3_ksl_lower_bound(&encoder->blocked_streams, &bsk);

  assert(!nghttp3_ksl_it_end(&it));
  assert(nghttp3_ksl_it_get(&it) == stream);

  nghttp3_ksl_remove_hint(&encoder->blocked_streams, NULL, &it, &bsk);
}